

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

string * __thiscall
cppcms::json::value::get_abi_cxx11_(string *__return_storage_ptr__,value *this,char *path,char *def)

{
  char cVar1;
  long *plVar2;
  allocator local_19;
  
  cppcms::json::value::find((char *)this);
  cVar1 = cppcms::json::value::is_undefined();
  if (cVar1 == '\0') {
    plVar2 = (long *)cppcms::json::value::str_abi_cxx11_();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,def,&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get(char const *path,char const *def) const
		{
			value const &v=find(path);
			if(v.is_undefined())
				return def;
			try {
				return v.get_value<std::string>();
			}
			catch(std::bad_cast const &e) {
				return def;
			}
		}